

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O2

bool __thiscall QFSFileEngine::setFileTime(QFSFileEngine *this,QDateTime *newDate,FileTime time)

{
  QFSFileEnginePrivate *this_00;
  undefined1 *puVar1;
  bool bVar2;
  int fd;
  long in_FS_OFFSET;
  QSystemError local_50;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  if ((this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i == 0) {
    qt_error_string((QString *)&local_48,0xd);
    QAbstractFileEngine::setError
              (&this->super_QAbstractFileEngine,PermissionsError,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    bVar2 = false;
  }
  else {
    local_50.errorCode = 0;
    local_50.errorScope = NoError;
    fd = QFSFileEnginePrivate::nativeHandle(this_00);
    bVar2 = QFileSystemEngine::setFileTime(fd,newDate,time,&local_50);
    if (bVar2) {
      puVar1 = (undefined1 *)
               ((long)&(this_00->metaData).knownFlagsMask.
                       super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 3);
      *puVar1 = *puVar1 & 0xfd;
    }
    else {
      QSystemError::toString((QString *)&local_48,&local_50);
      QAbstractFileEngine::setError
                (&this->super_QAbstractFileEngine,PermissionsError,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::setFileTime(const QDateTime &newDate, QFile::FileTime time)
{
    Q_D(QFSFileEngine);

    if (d->openMode == QIODevice::NotOpen) {
        setError(QFile::PermissionsError, qt_error_string(EACCES));
        return false;
    }

    QSystemError error;
    if (!QFileSystemEngine::setFileTime(d->nativeHandle(), newDate, time, error)) {
        setError(QFile::PermissionsError, error.toString());
        return false;
    }

    d->metaData.clearFlags(QFileSystemMetaData::Times);
    return true;
}